

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.c
# Opt level: O0

int fileIn_version_2(FILE *fp)

{
  object *poVar1;
  int64_t iVar2;
  int64_t iVar3;
  int64_t end;
  int64_t start;
  object *imageTop;
  object *imagePointer;
  object *imageBase;
  int64_t totalCells;
  int64_t newOffset;
  object *fixer;
  FILE *pFStack_10;
  int i;
  FILE *fp_local;
  
  imageBase = (object *)0x0;
  pFStack_10 = (FILE *)fp;
  fread(&imagePointer,8,1,(FILE *)fp);
  fprintf(_stderr,"Read in image imageBase=%p\n",imagePointer);
  fread(&imageTop,8,1,pFStack_10);
  fprintf(_stderr,"Read in image imagePointer=%p\n",imageTop);
  fread(&start,8,1,pFStack_10);
  fprintf(_stderr,"Read in image imageTop=%p\n",start);
  imageBase = (object *)(long)(((int)start - (int)imageTop) / 8);
  fprintf(_stderr,"Image has %ld cells.\n",imageBase);
  fprintf(_stderr,"memoryBase is %p\n",memoryBase);
  fprintf(_stderr,"memoryPointer is %p\n",memoryPointer);
  fprintf(_stderr,"memoryTop is %p\n",memoryTop);
  totalCells = (long)memoryBase - (long)imagePointer;
  fprintf(_stderr,"Address offset between image and current memory pointer is %ld bytes.\n",
          totalCells);
  totalCells = totalCells / 8;
  fprintf(_stderr,"Address offset between image and current memory pointer is %ld cells.\n",
          totalCells);
  memoryPointer = (object *)((long)memoryTop + (long)imageBase * -8);
  fread(&globalsObject,8,1,pFStack_10);
  globalsObject = fix_offset(globalsObject,totalCells);
  addStaticRoot(&globalsObject);
  fprintf(_stderr,"Read in globals object=%p\n",globalsObject);
  fread(&initialMethod,8,1,pFStack_10);
  initialMethod = fix_offset(initialMethod,totalCells);
  addStaticRoot(&initialMethod);
  fprintf(_stderr,"Read in initial method=%p\n",initialMethod);
  fprintf(_stderr,"Reading binary message objects.\n");
  for (fixer._4_4_ = 0; (int)fixer._4_4_ < 3; fixer._4_4_ = fixer._4_4_ + 1) {
    fread(binaryMessages + (int)fixer._4_4_,8,1,pFStack_10);
    poVar1 = fix_offset(binaryMessages[(int)fixer._4_4_],totalCells);
    binaryMessages[(int)fixer._4_4_] = poVar1;
    addStaticRoot(binaryMessages + (int)fixer._4_4_);
    fprintf(_stderr,"  Read in binary message %d=%p\n",(ulong)fixer._4_4_,
            binaryMessages[(int)fixer._4_4_]);
  }
  fread(&badMethodSym,8,1,pFStack_10);
  badMethodSym = fix_offset(badMethodSym,totalCells);
  addStaticRoot(&badMethodSym);
  fprintf(_stderr,"Read in doesNotUnderstand: symbol=%p\n",badMethodSym);
  fread(memoryPointer,8,(size_t)imageBase,pFStack_10);
  iVar2 = time_usec();
  for (newOffset = (int64_t)memoryPointer; (ulong)newOffset < memoryTop;
      newOffset = (int64_t)object_fix_up((object *)newOffset,totalCells)) {
  }
  iVar3 = time_usec();
  nilObject = lookupGlobal("nil");
  addStaticRoot(&nilObject);
  trueObject = lookupGlobal("true");
  addStaticRoot(&trueObject);
  falseObject = lookupGlobal("false");
  addStaticRoot(&falseObject);
  ArrayClass = lookupGlobal("Array");
  addStaticRoot(&ArrayClass);
  BlockClass = lookupGlobal("Block");
  addStaticRoot(&BlockClass);
  ByteArrayClass = lookupGlobal("ByteArray");
  addStaticRoot(&ByteArrayClass);
  ContextClass = lookupGlobal("Context");
  addStaticRoot(&ContextClass);
  DictionaryClass = lookupGlobal("Dictionary");
  addStaticRoot(&DictionaryClass);
  IntegerClass = lookupGlobal("Integer");
  addStaticRoot(&IntegerClass);
  SmallIntClass = lookupGlobal("SmallInt");
  addStaticRoot(&SmallIntClass);
  StringClass = lookupGlobal("String");
  addStaticRoot(&StringClass);
  SymbolClass = lookupGlobal("Symbol");
  addStaticRoot(&SymbolClass);
  UndefinedClass = lookupGlobal("Undefined");
  addStaticRoot(&UndefinedClass);
  fprintf(_stderr,"Object fix up took %d usec.\n",(ulong)(uint)((int)iVar3 - (int)iVar2));
  fprintf(_stderr,"Read in %ld cells.\n",imageBase);
  return (int)imageBase;
}

Assistant:

int fileIn_version_2(FILE *fp)
{
    int i;
    struct object *fixer;
    int64_t newOffset;
    int64_t totalCells = 0;
    struct object *imageBase;
    struct object *imagePointer;
    struct object *imageTop;

    /* read in the bottom, pointer and top of the image */
    fread(&imageBase, sizeof imageBase, 1, fp);
    fprintf(stderr, "Read in image imageBase=%p\n", (void *)imageBase);

    fread(&imagePointer, sizeof imagePointer, 1, fp);
    fprintf(stderr, "Read in image imagePointer=%p\n", (void *)imagePointer);

    fread(&imageTop, sizeof imageTop, 1, fp);
    fprintf(stderr, "Read in image imageTop=%p\n", (void *)imageTop);

    /* how many cells? */
    totalCells = ((int)(((intptr_t)imageTop - (intptr_t)imagePointer)))/(int)BytesPerWord;
    fprintf(stderr, "Image has %" PRId64 " cells.\n", totalCells);

    fprintf(stderr, "memoryBase is %p\n", (void *)memoryBase);
    fprintf(stderr, "memoryPointer is %p\n", (void *)memoryPointer);
    fprintf(stderr, "memoryTop is %p\n", (void *)memoryTop);

    /* what is the offset between the saved pointer and our current pointer? In cells! */
    newOffset = (int64_t)((intptr_t)memoryBase - (intptr_t)imageBase);
    fprintf(stderr, "Address offset between image and current memory pointer is %" PRId64 " bytes.\n", newOffset);

    newOffset = (int64_t)newOffset/(int64_t)BytesPerWord;
    fprintf(stderr, "Address offset between image and current memory pointer is %" PRId64 " cells.\n", newOffset);

    /* set up lower pointer */
    memoryPointer = WORDSDOWN(memoryTop, totalCells);


    /* read in core object pointers. */

    /* everything starts with globals */
    fread(&globalsObject, sizeof globalsObject, 1, fp);
    globalsObject = fix_offset(globalsObject, newOffset);
    addStaticRoot(&globalsObject);
    fprintf(stderr, "Read in globals object=%p\n", (void *)globalsObject);

    fread(&initialMethod, sizeof initialMethod, 1, fp);
    initialMethod = fix_offset(initialMethod, newOffset);
    addStaticRoot(&initialMethod);
    fprintf(stderr, "Read in initial method=%p\n", (void *)initialMethod);

    fprintf(stderr, "Reading binary message objects.\n");
    for (i = 0; i < 3; i++) {
        fread(&(binaryMessages[i]), sizeof binaryMessages[i], 1, fp);
        binaryMessages[i] = fix_offset(binaryMessages[i], newOffset);
        addStaticRoot(&binaryMessages[i]);
        fprintf(stderr, "  Read in binary message %d=%p\n", i, (void *)binaryMessages[i]);
    }

    fread(&badMethodSym, sizeof badMethodSym, 1, fp);
    badMethodSym = fix_offset(badMethodSym, newOffset);
    addStaticRoot(&badMethodSym);
    fprintf(stderr, "Read in doesNotUnderstand: symbol=%p\n", (void *)badMethodSym);

    /* read in the raw image data. */
    fread(memoryPointer, BytesPerWord, (size_t)totalCells, fp);

    /* fix up the rest of the objects. */

    int64_t start = time_usec();
    fixer = memoryPointer;
    while(fixer < memoryTop) {
        //fprintf(stderr, "Fixing up object %d: ", obj_count++);
        fixer = object_fix_up(fixer, newOffset);
    }
    int64_t end = time_usec();

    /* fix up everything from globals. */
    nilObject = lookupGlobal("nil");
    addStaticRoot(&nilObject);

    trueObject = lookupGlobal("true");
    addStaticRoot(&trueObject);

    falseObject = lookupGlobal("false");
    addStaticRoot(&falseObject);

    ArrayClass = lookupGlobal("Array");
    addStaticRoot(&ArrayClass);

    BlockClass = lookupGlobal("Block");
    addStaticRoot(&BlockClass);

    ByteArrayClass = lookupGlobal("ByteArray");
    addStaticRoot(&ByteArrayClass);

    ContextClass = lookupGlobal("Context");
    addStaticRoot(&ContextClass);

    DictionaryClass = lookupGlobal("Dictionary");
    addStaticRoot(&DictionaryClass);

    IntegerClass = lookupGlobal("Integer");
    addStaticRoot(&IntegerClass);

    SmallIntClass = lookupGlobal("SmallInt");
    addStaticRoot(&SmallIntClass);

    StringClass = lookupGlobal("String");
    addStaticRoot(&StringClass);

    SymbolClass = lookupGlobal("Symbol");
    addStaticRoot(&SymbolClass);

    UndefinedClass = lookupGlobal("Undefined");
    addStaticRoot(&UndefinedClass);

    fprintf(stderr, "Object fix up took %d usec.\n", (int)(end - start));

    fprintf(stderr, "Read in %" PRId64 " cells.\n", totalCells);

    return (int)totalCells;
}